

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  bool bVar1;
  long in_RSI;
  vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
  *in_RDI;
  AssertionOrBenchmarkResult *assertionOrBenchmark;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
  *__range1;
  AssertionStats *in_stack_000001f8;
  JunitReporter *in_stack_00000200;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
  local_20;
  long local_18;
  
  local_18 = in_RSI + 0x78;
  local_20._M_current =
       (AssertionOrBenchmarkResult *)
       std::
       vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
       ::begin(in_RDI);
  std::
  vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
  ::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
                             *)in_RDI), bVar1) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
         ::operator*(&local_20);
    bVar1 = Detail::AssertionOrBenchmarkResult::isAssertion((AssertionOrBenchmarkResult *)0x1a8681);
    if (bVar1) {
      Detail::AssertionOrBenchmarkResult::asAssertion((AssertionOrBenchmarkResult *)0x1a8691);
      writeAssertion(in_stack_00000200,in_stack_000001f8);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void JunitReporter::writeAssertions( SectionNode const& sectionNode ) {
        for (auto const& assertionOrBenchmark : sectionNode.assertionsAndBenchmarks) {
            if (assertionOrBenchmark.isAssertion()) {
                writeAssertion(assertionOrBenchmark.asAssertion());
            }
        }
    }